

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O0

PpRgbCfg * get_pp_rgb_Cfg(MppFrameFormat fmt)

{
  byte local_21;
  PpRgbCfg *pPStack_20;
  RK_U8 i;
  PpRgbCfg *cfg_array;
  PpRgbCfg *cfg;
  MppFrameFormat fmt_local;
  
  if ((fmt & 0x1000000) == 0x1000000) {
    pPStack_20 = pp_rgb_le_cfgs;
  }
  else {
    pPStack_20 = pp_rgb_cfgs;
  }
  local_21 = 0;
  while( true ) {
    if (9 < local_21) {
      return (PpRgbCfg *)0x0;
    }
    if (pPStack_20[local_21].fmt == fmt) break;
    local_21 = local_21 + 1;
  }
  return pPStack_20 + local_21;
}

Assistant:

PpRgbCfg* get_pp_rgb_Cfg(MppFrameFormat fmt)
{
    PpRgbCfg* cfg = NULL;
    PpRgbCfg* cfg_array = NULL;
    RK_U8 i = 0;

    if (MPP_FRAME_FMT_IS_LE(fmt))
        cfg_array = pp_rgb_le_cfgs;
    else
        cfg_array = pp_rgb_cfgs;

    for (i = 0; i < PP_RGB_CFG_LENTH; i++) {
        if (cfg_array[i].fmt ==  fmt) {
            cfg = &cfg_array[i];
            break;
        }
    }

    return cfg;
}